

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colMap.c
# Opt level: O3

int Col_MapSet(Col_Word map,Col_Word key,Col_Word value)

{
  uint uVar1;
  int iVar2;
  code *pcVar3;
  Col_Word CVar4;
  code *compareKeysProc;
  int iStack_14;
  
  if (map == 0) {
    return 0;
  }
  if ((map & 0xf) == 0) {
    if ((*(byte *)map & 2) != 0) {
      uVar1 = *(byte *)map & 0xfffffffe;
      goto LAB_00111d27;
    }
LAB_00111d36:
    iVar2 = *(int *)(*(ulong *)map & 0xfffffffffffffffe);
    if (iVar2 == 0x800) {
      iVar2 = (**(code **)((int *)(*(ulong *)map & 0xfffffffffffffffe) + 0xe))();
      return iVar2;
    }
    if (iVar2 != 0x4000) {
Col_HashMapSet:
      iStack_14 = 1;
      pcVar3 = HashString;
      compareKeysProc = CompareStrings;
      if (((map & 0xf) == 0 && map != 0) && ((*(byte *)map & 2) == 0)) {
        pcVar3 = *(code **)((*(ulong *)map & 0xfffffffffffffffe) + 0x28);
        compareKeysProc = *(code **)((*(ulong *)map & 0xfffffffffffffffe) + 0x30);
      }
      CVar4 = HashMapFindEntry(map,pcVar3,compareKeysProc,key,1,&iStack_14,(size_t *)0x0);
      *(Col_Word *)(CVar4 + 0x18) = value;
      return iStack_14;
    }
  }
  else {
    uVar1 = immediateWordTypes[(uint)map & 0x1f];
LAB_00111d27:
    if (uVar1 != 0x42) {
      if (uVar1 == 0x2a) goto Col_HashMapSet;
      if (uVar1 != 0xffffffff) {
        return 0;
      }
      goto LAB_00111d36;
    }
  }
  pcVar3 = Col_TrieMapSet;
  if (map == 0) goto LAB_0011428d;
  if ((map & 0xf) == 0) {
    if ((*(byte *)map & 2) != 0) {
      uVar1 = *(byte *)map & 0xfffffffe;
      goto LAB_00114257;
    }
  }
  else {
    pcVar3 = (code *)(ulong)((uint)map & 0x1f);
    uVar1 = immediateWordTypes[(long)pcVar3];
LAB_00114257:
    if (uVar1 != 0xffffffff) {
      if (uVar1 == 0x42) {
        pcVar3 = (code *)StringTrieMapFindEntry
                                   (map,key,1,(int *)&stack0xfffffffffffffff4,(Col_Word *)0x0,
                                    (Col_Word *)0x0);
      }
      goto LAB_0011428d;
    }
  }
  pcVar3 = (code *)TrieMapFindEntry(map,key,1,(int *)&stack0xfffffffffffffff4,(Col_Word *)0x0,
                                    (Col_Word *)0x0);
LAB_0011428d:
  *(Col_Word *)(pcVar3 + 0x18) = value;
  return 1;
}

Assistant:

int
Col_MapSet(
    Col_Word map,   /*!< Map to insert entry into. */
    Col_Word key,   /*!< Entry key. Can be any word type, including string,
                         however it must match the actual type used by the
                         map. */
    Col_Word value) /*!< Entry value. */
{
    Col_MapSetProc *proc;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_WORDMAP,map} */
    TYPECHECK_WORDMAP(map) return 0;

    switch (WORD_TYPE(map)) {
    case WORD_TYPE_STRHASHMAP:
        proc = Col_HashMapSet;
        break;

    case WORD_TYPE_STRTRIEMAP:
        proc = Col_TrieMapSet;
        break;

    case WORD_TYPE_CUSTOM: {
        Col_CustomMapType *type = (Col_CustomMapType *) WORD_TYPEINFO(map);
        switch (type->type.type) {
        case COL_HASHMAP: proc = Col_HashMapSet; break;
        case COL_TRIEMAP: proc = Col_TrieMapSet; break;
        case COL_MAP:     proc = type->setProc; break;
        }
        break;
        }

    /* WORD_TYPE_UNKNOWN */

    default:
        /* CANTHAPPEN */
        ASSERT(0);
        return 0;
    }

    return proc(map, key, value);
}